

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

int get_segctl_physical_address
              (CPUMIPSState_conflict5 *env,hwaddr *physical,int *prot,target_ulong real_address,
              int rw,int access_type,int mmu_idx,uint16_t segctl,target_ulong segmask)

{
  int iVar1;
  hwaddr pa;
  _Bool eu;
  uint am;
  int access_type_local;
  int rw_local;
  target_ulong real_address_local;
  int *prot_local;
  hwaddr *physical_local;
  CPUMIPSState_conflict5 *env_local;
  
  iVar1 = get_seg_physical_address
                    (env,physical,prot,real_address,rw,access_type,mmu_idx,
                     (uint)(((ulong)segctl & 0x70) >> 4),((int)(uint)segctl >> 3 & 1U) != 0,segmask,
                     ((ulong)segctl & 0xfe00) << 0x14 & (segmask ^ 0xffffffffffffffff));
  return iVar1;
}

Assistant:

static int get_segctl_physical_address(CPUMIPSState *env, hwaddr *physical,
                                       int *prot, target_ulong real_address,
                                       int rw, int access_type, int mmu_idx,
                                       uint16_t segctl, target_ulong segmask)
{
    unsigned int am = (segctl & CP0SC_AM_MASK) >> CP0SC_AM;
    bool eu = (segctl >> CP0SC_EU) & 1;
    hwaddr pa = ((hwaddr)segctl & CP0SC_PA_MASK) << 20;

    return get_seg_physical_address(env, physical, prot, real_address, rw,
                                    access_type, mmu_idx, am, eu, segmask,
                                    pa & ~(hwaddr)segmask);
}